

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>,float>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
               *expression)

{
  long *plVar1;
  CoordinateOrder CVar2;
  View<float,_true,_std::allocator<unsigned_long>_> *pVVar3;
  pointer pfVar4;
  pointer pfVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  runtime_error *prVar10;
  size_t sVar11;
  pointer puVar12;
  ulong uVar13;
  long lVar14;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_a1;
  long local_a0;
  View<float,_true,_std::allocator<unsigned_long>_> *local_98;
  BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
  *local_90;
  reference local_88;
  ulong local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_50;
  long local_48;
  
  if (((v->geometry_).size_ == 0) || ((expression->e_->geometry_).size_ == 0)) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Assertion failed.");
  }
  else {
    sVar8 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
            ::dimension(expression);
    if (v->data_ == (pointer)0x0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"Assertion failed.");
    }
    else {
      sVar9 = (v->geometry_).dimension_;
      if (sVar8 == sVar9) {
        if (sVar9 == 0) {
          if (((v->geometry_).size_ == 1) && ((expression->e_->geometry_).size_ == 1)) {
LAB_00209c5c:
            bVar7 = BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>
                    ::overlaps<float,false,std::allocator<unsigned_long>>
                              ((BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>
                                *)expression,v);
            if (bVar7) {
              Marray<float,std::allocator<unsigned_long>>::
              Marray<andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>,float>
                        ((Marray<float,std::allocator<unsigned_long>> *)&local_78,
                         (ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>,_float>
                          *)expression,&local_a1);
              operate<andres::marray_detail::Assign<float,float>,float,float,false,std::allocator<unsigned_long>>
                        (v,&local_78);
              operator_delete((void *)CONCAT44(local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_),
                              local_48 << 2);
              uVar13 = local_50 * 0x18;
              puVar12 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00209eca:
              operator_delete(puVar12,uVar13);
              return;
            }
            if (v->data_ == (pointer)0x0) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar10,"Assertion failed.");
            }
            else {
              if ((v->geometry_).dimension_ == 0) {
                *v->data_ = *expression->e_->data_ * expression->scalar_;
                return;
              }
              View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
              if (((v->geometry_).isSimple_ == true) &&
                 (pVVar3 = expression->e_,
                 View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar3),
                 (pVVar3->geometry_).isSimple_ == true)) {
                View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
                CVar2 = (v->geometry_).coordinateOrder_;
                pVVar3 = expression->e_;
                View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar3);
                if (CVar2 == (pVVar3->geometry_).coordinateOrder_) {
                  sVar8 = (v->geometry_).size_;
                  if (sVar8 == 0) {
                    return;
                  }
                  pfVar4 = v->data_;
                  pfVar5 = expression->e_->data_;
                  sVar9 = 0;
                  do {
                    pfVar4[sVar9] = pfVar5[sVar9] * expression->scalar_;
                    sVar9 = sVar9 + 1;
                  } while (sVar8 != sVar9);
                  return;
                }
              }
              local_98 = expression->e_;
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_88 = AccessOperatorHelper<true>::
                         execute<float,int,true,std::allocator<unsigned_long>>
                                   (local_98,(int *)&local_78);
              if (v->data_ != (pointer)0x0) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_78,(v->geometry_).dimension_,(allocator_type *)&local_a1);
                if (v->data_ == (pointer)0x0) {
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar10,"Assertion failed.");
                  __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_80 = (v->geometry_).dimension_ - 1;
                local_a0 = 0;
                lVar14 = 0;
                local_90 = expression;
                do {
                  v->data_[lVar14] = local_88[local_a0] * local_90->scalar_;
                  if (v->data_ == (pointer)0x0) {
LAB_00209ef4:
                    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar10,"Assertion failed.");
                    __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  uVar13 = 0;
                  while (bVar7 = (v->geometry_).dimension_ <= uVar13, !bVar7) {
                    lVar6 = *(long *)(CONCAT44(local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     uVar13 * 8);
                    sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar13);
                    if (lVar6 + 1U != sVar8) {
                      sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,uVar13);
                      sVar9 = View<float,_true,_std::allocator<unsigned_long>_>::strides
                                        (local_98,uVar13);
                      local_a0 = local_a0 + sVar9;
                      lVar14 = lVar14 + sVar8;
                      plVar1 = (long *)(CONCAT44(local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       uVar13 * 8);
                      *plVar1 = *plVar1 + 1;
                      bVar7 = true;
                      break;
                    }
                    if (local_80 == uVar13) break;
                    lVar6 = *(long *)(CONCAT44(local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     uVar13 * 8);
                    sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,uVar13);
                    sVar9 = View<float,_true,_std::allocator<unsigned_long>_>::strides
                                      (local_98,uVar13);
                    sVar11 = View<float,_true,_std::allocator<unsigned_long>_>::shape
                                       (local_98,uVar13);
                    local_a0 = local_a0 - (sVar11 - 1) * sVar9;
                    lVar14 = lVar14 - sVar8 * lVar6;
                    *(undefined8 *)
                     (CONCAT44(local_78.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_78.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar13 * 8) = 0;
                    uVar13 = uVar13 + 1;
                    if (v->data_ == (pointer)0x0) goto LAB_00209ef4;
                  }
                } while (bVar7);
                puVar12 = (pointer)CONCAT44(local_78.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_78.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
                if (puVar12 == (pointer)0x0) {
                  return;
                }
                uVar13 = (long)local_78.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar12;
                goto LAB_00209eca;
              }
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar10,"Assertion failed.");
            }
          }
          else {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar10,"Assertion failed.");
          }
        }
        else {
          if (v->data_ != (pointer)0x0) {
            uVar13 = 0;
            do {
              if ((v->geometry_).dimension_ <= uVar13) goto LAB_00209c5c;
              sVar8 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar13);
              sVar9 = View<float,_true,_std::allocator<unsigned_long>_>::shape
                                (expression->e_,uVar13);
              if (sVar8 != sVar9) {
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar10,"Assertion failed.");
                goto LAB_00209f42;
              }
              uVar13 = uVar13 + 1;
            } while (v->data_ != (pointer)0x0);
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"Assertion failed.");
        }
      }
      else {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Assertion failed.");
      }
    }
  }
LAB_00209f42:
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}